

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeIncludes
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  bool bVar2;
  string *psVar3;
  string local_178;
  undefined1 local_151;
  string local_150;
  cmValue local_130;
  cmValue cincludes;
  undefined1 local_120 [8];
  string INCLUDE_DIRECTORIES;
  string local_d0;
  undefined1 local_b0 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string *config_local;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *includesString;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&genexInterpreter.Language.field_2 + 8));
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_d0,(string *)config);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string
            ((string *)(INCLUDE_DIRECTORIES.field_2._M_local_buf + 8),(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_b0,(cmLocalGenerator *)pcVar1,&local_d0,
             headTarget,(string *)((long)&INCLUDE_DIRECTORIES.field_2 + 8));
  std::__cxx11::string::~string((string *)(INCLUDE_DIRECTORIES.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"INCLUDE_DIRECTORIES",
             (allocator<char> *)((long)&cincludes.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cincludes.Value + 7));
  local_130 = cmSourceFile::GetProperty(source,(string *)local_120);
  bVar2 = cmValue::operator_cast_to_bool(&local_130);
  if (bVar2) {
    pcVar1 = this->LocalGenerator;
    psVar3 = cmValue::operator*[abi_cxx11_(&local_130);
    std::__cxx11::string::string((string *)&local_150,(string *)psVar3);
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_b0,&local_150,(string *)local_120)
    ;
    cmLocalGenerator::AppendIncludeDirectories
              ((cmLocalGenerator *)pcVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genexInterpreter.Language.field_2 + 8),psVar3,source);
    std::__cxx11::string::~string((string *)&local_150);
  }
  local_151 = 0;
  cmLocalGenerator::GetIncludeFlags
            (__return_storage_ptr__,(cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genexInterpreter.Language.field_2 + 8),
             (this->super_cmCommonTargetGenerator).GeneratorTarget,language,config,false);
  pcVar1 = this->LocalGenerator;
  cmCommonTargetGenerator::GetIncludes
            (&local_178,&this->super_cmCommonTargetGenerator,language,config);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,__return_storage_ptr__,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  local_151 = 1;
  std::__cxx11::string::~string((string *)local_120);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&genexInterpreter.Language.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeIncludes(
  cmSourceFile const* source, const std::string& language,
  const std::string& config)
{
  std::vector<std::string> includes;
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (cmValue cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    this->LocalGenerator->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(*cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  std::string includesString = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, language, config, false);
  this->LocalGenerator->AppendFlags(includesString,
                                    this->GetIncludes(language, config));

  return includesString;
}